

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O2

ByteString * validate_chunk(ByteString *FB,ByteString *CB,ui32_t *nonce_value)

{
  int iVar1;
  byte_t *pbVar2;
  byte_t *pbVar3;
  ui32_t *in_RCX;
  Result_t *pRVar4;
  CTR_Setup counter;
  
  if (in_RCX != (ui32_t *)0x0) {
    pbVar2 = Kumu::ByteString::RoData(CB);
    CTR_Setup::SetupRead(&counter,pbVar2);
    pbVar2 = Kumu::ByteString::Data((ByteString *)nonce_value);
    CTR_Setup::FillRandom(&counter,pbVar2 + 0x20,0xfffe0);
    pbVar2 = Kumu::ByteString::RoData(CB);
    pbVar3 = Kumu::ByteString::RoData((ByteString *)nonce_value);
    iVar1 = bcmp(pbVar2 + 0x20,pbVar3 + 0x20,0xfffe0);
    if (iVar1 == 0) {
      *in_RCX = counter.m_nonce;
      pRVar4 = (Result_t *)&Kumu::RESULT_OK;
    }
    else {
      fwrite("Check data mismatched in chunk\n",0x1f,1,_stderr);
      pRVar4 = (Result_t *)&Kumu::RESULT_FAIL;
    }
    Kumu::Result_t::Result_t((Result_t *)FB,pRVar4);
    return FB;
  }
  __assert_fail("nonce_value",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                ,0x14a,"Result_t validate_chunk(ByteString &, ByteString &, ui32_t *)");
}

Assistant:

Result_t
validate_chunk(ByteString& FB, ByteString& CB, ui32_t* nonce_value)
{
  assert(nonce_value);
  CTR_Setup counter;
  counter.SetupRead(FB.RoData());

  counter.FillRandom(CB.Data() + counter.WriteSize(),
		     Megabyte - counter.WriteSize());

  if ( memcmp(FB.RoData() + counter.WriteSize(),
	      CB.RoData() + counter.WriteSize(),
	      Megabyte - counter.WriteSize()) != 0 )
    {
      fprintf(stderr, "Check data mismatched in chunk\n");
      return RESULT_FAIL;
    }

  *nonce_value = counter.Nonce();

  return RESULT_OK;
}